

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O2

void __thiscall ED::JoinAnchorPointsUsingSortedAnchors(ED *this)

{
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *this_00;
  pointer *ppPVar1;
  Point PVar2;
  undefined8 uVar3;
  short *psVar4;
  Point *pPVar5;
  const_iterator __position;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *chainNos;
  void *__s;
  int *piVar13;
  Chain *chains;
  int *piVar14;
  uchar *puVar15;
  ulong uVar16;
  pointer pvVar17;
  uint uVar18;
  long lVar19;
  int *piVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  size_t sVar25;
  long lVar26;
  long lVar27;
  int *piVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  uint uVar45;
  uint uVar46;
  int local_8c;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_48;
  
  iVar6 = this->width;
  iVar32 = this->height;
  iVar12 = iVar32 + iVar6;
  uVar29 = 0xffffffffffffffff;
  uVar30 = (long)(iVar12 * 8) << 2;
  if (iVar12 < 0) {
    uVar30 = uVar29;
  }
  chainNos = (int *)operator_new__(uVar30);
  iVar32 = iVar32 * iVar6;
  lVar33 = (long)iVar32;
  sVar25 = lVar33 * 8;
  if (iVar32 < 0) {
    sVar25 = uVar29;
  }
  __s = operator_new__(sVar25);
  if (iVar32 != 0) {
    memset(__s,0,lVar33 * 8);
  }
  uVar16 = lVar33 << 5;
  uVar30 = lVar33 << 4;
  if (iVar32 < 0) {
    uVar16 = uVar29;
    uVar30 = uVar29;
  }
  piVar13 = (int *)operator_new__(uVar30);
  chains = (Chain *)operator_new__(uVar16);
  piVar14 = sortAnchorsByGradValue1(this);
  uVar29 = (ulong)(uint)this->anchorNos;
  this_00 = &this->segmentPoints;
LAB_00104fe7:
  do {
    if ((int)uVar29 < 1) {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::pop_back(this_00);
      operator_delete__(piVar14);
      operator_delete__(chains);
      operator_delete__(piVar13);
      operator_delete__(chainNos);
      operator_delete__(__s);
      return;
    }
    iVar12 = this->width;
    iVar6 = piVar14[uVar29 - 1] / iVar12;
    iVar32 = piVar14[uVar29 - 1] % iVar12;
    uVar29 = uVar29 - 1;
    puVar15 = this->edgeImg;
    iVar22 = iVar6 * iVar12 + iVar32;
  } while (puVar15[iVar22] != 0xfe);
  chains->children[1] = -1;
  chains->dir = 0;
  chains->len = 0;
  chains->parent = -1;
  chains->children[0] = -1;
  chains->pixels = (Point *)0x0;
  bVar36 = this->dirImg[iVar22] == '\x01';
  *piVar13 = iVar6;
  piVar13[1] = iVar32;
  piVar13[3] = bVar36 + 2 + (uint)bVar36;
  piVar13[2] = 0;
  piVar13[4] = iVar6;
  piVar13[5] = iVar32;
  piVar13[7] = (uint)bVar36 * 2 + 1;
  piVar13[6] = 0;
  local_8c = 0;
  uVar18 = 1;
  uVar30 = 0;
  lVar33 = 1;
  do {
    lVar33 = (long)(int)lVar33;
LAB_00105093:
    iVar6 = (int)uVar30;
    iVar32 = (int)lVar33;
    if ((int)uVar18 < 0) break;
    uVar30 = (ulong)uVar18;
    iVar22 = piVar13[uVar30 * 4];
    iVar31 = piVar13[uVar30 * 4 + 1];
    iVar7 = piVar13[uVar30 * 4 + 3];
    iVar44 = piVar13[uVar30 * 4 + 2];
    local_8c = local_8c + (uint)(puVar15[iVar12 * iVar22 + iVar31] != 0xff);
    chains[lVar33].children[0] = -1;
    chains[lVar33].children[1] = -1;
    chains[lVar33].dir = iVar7;
    chains[lVar33].parent = iVar44;
    lVar26 = (long)iVar6;
    chains[lVar33].pixels = (Point *)((long)__s + lVar26 * 8);
    *(int *)((long)__s + lVar26 * 8 + 4) = iVar22;
    *(int *)((long)__s + lVar26 * 8) = iVar31;
    piVar28 = piVar13 + uVar30 * 4;
    iVar6 = iVar6 + 1;
    lVar26 = (long)iVar6;
    if (iVar7 == 1) {
      piVar20 = (int *)((long)__s + lVar26 * 8 + 4);
      iVar7 = iVar31 + -1;
      lVar19 = 0;
      while( true ) {
        uVar45 = (uint)lVar19;
        iVar11 = iVar12 * iVar22 + iVar31 + uVar45;
        if (this->dirImg[iVar11] != '\x02') break;
        puVar15[iVar11] = 0xff;
        puVar15 = this->edgeImg;
        iVar24 = iVar22 + -1;
        iVar12 = this->width;
        iVar11 = iVar12 * iVar24 + iVar31 + uVar45;
        if (puVar15[iVar11] == 0xfe) {
          puVar15[iVar11] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
        }
        iVar23 = iVar22 + 1;
        iVar11 = iVar12 * iVar23 + iVar31 + uVar45;
        if (puVar15[iVar11] == 0xfe) {
          puVar15[iVar11] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
        }
        iVar8 = iVar12 * iVar22 + iVar7 + uVar45;
        iVar11 = iVar22;
        if (((puVar15[iVar8] < 0xfe) &&
            (iVar9 = iVar12 * iVar24 + iVar7 + uVar45, iVar11 = iVar24, puVar15[iVar9] < 0xfe)) &&
           (iVar10 = iVar12 * iVar23 + iVar7 + uVar45, iVar11 = iVar23, puVar15[iVar10] < 0xfe)) {
          psVar4 = this->gradImg;
          if (psVar4[iVar8] < psVar4[iVar9]) {
            iVar11 = iVar24;
            if (psVar4[iVar9] <= psVar4[iVar10]) {
              iVar11 = iVar23;
            }
          }
          else if (psVar4[iVar10] <= psVar4[iVar8]) {
            iVar11 = iVar22;
          }
        }
        iVar22 = iVar11;
        iVar11 = iVar22 * iVar12 + iVar7 + uVar45;
        if ((puVar15[iVar11] == 0xff) || ((int)this->gradImg[iVar11] < this->gradThresh)) {
          chains[lVar33].len = 1 - uVar45;
          piVar28 = chains[iVar44].children;
          uVar30 = lVar26 - lVar19;
          goto LAB_00105895;
        }
        *piVar20 = iVar22;
        piVar20[-1] = iVar7 + uVar45;
        lVar19 = lVar19 + -1;
        piVar20 = piVar20 + 2;
      }
      *piVar28 = iVar22;
      piVar28[1] = iVar31 + uVar45;
      piVar28[3] = 4;
      piVar28[2] = iVar32;
      piVar13[uVar30 * 4 + 4] = iVar22;
      piVar13[uVar30 * 4 + 5] = iVar31 + uVar45;
      piVar13[uVar30 * 4 + 7] = 3;
      piVar13[uVar30 * 4 + 6] = iVar32;
      chains[lVar33].len = ~uVar45 + 1;
      chains[iVar44].children[0] = iVar32;
      iVar6 = iVar6 - uVar45;
      goto LAB_001057e6;
    }
    if (iVar7 == 2) {
      lVar19 = 0;
      while( true ) {
        iVar11 = (int)lVar19;
        iVar7 = iVar12 * iVar22 + iVar31 + iVar11;
        if (this->dirImg[iVar7] != '\x02') break;
        puVar15[iVar7] = 0xff;
        puVar15 = this->edgeImg;
        iVar24 = iVar22 + 1;
        iVar12 = this->width;
        iVar7 = iVar12 * iVar24 + iVar31 + iVar11;
        if (puVar15[iVar7] == 0xfe) {
          puVar15[iVar7] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
        }
        iVar23 = iVar22 + -1;
        iVar7 = iVar12 * iVar23 + iVar31 + iVar11;
        if (puVar15[iVar7] == 0xfe) {
          puVar15[iVar7] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
        }
        iVar8 = iVar12 * iVar22 + iVar31 + iVar11 + 1;
        iVar7 = iVar22;
        if (((puVar15[iVar8] < 0xfe) &&
            (iVar9 = iVar12 * iVar24 + iVar31 + iVar11 + 1, iVar7 = iVar24, puVar15[iVar9] < 0xfe))
           && (iVar10 = iVar12 * iVar23 + iVar31 + iVar11 + 1, iVar7 = iVar23,
              puVar15[iVar10] < 0xfe)) {
          psVar4 = this->gradImg;
          if (psVar4[iVar8] < psVar4[iVar10]) {
            if (psVar4[iVar10] <= psVar4[iVar9]) {
              iVar7 = iVar24;
            }
          }
          else {
            iVar7 = iVar24;
            if (psVar4[iVar9] <= psVar4[iVar8]) {
              iVar7 = iVar22;
            }
          }
        }
        iVar22 = iVar7;
        iVar7 = iVar22 * iVar12 + iVar31 + iVar11 + 1;
        if ((puVar15[iVar7] == 0xff) || ((int)this->gradImg[iVar7] < this->gradThresh)) {
          chains[lVar33].len = iVar11 + 1;
          piVar28 = chains[iVar44].children + 1;
          uVar30 = lVar26 + lVar19;
          goto LAB_00105895;
        }
        *(int *)((long)__s + lVar19 * 8 + lVar26 * 8 + 4) = iVar22;
        *(int *)((long)__s + lVar19 * 8 + lVar26 * 8) = iVar31 + iVar11 + 1;
        lVar19 = lVar19 + 1;
      }
      *piVar28 = iVar22;
      piVar28[1] = iVar31 + iVar11;
      piVar28[3] = 4;
      piVar28[2] = iVar32;
      piVar13[uVar30 * 4 + 4] = iVar22;
      piVar13[uVar30 * 4 + 5] = iVar31 + iVar11;
      piVar13[uVar30 * 4 + 7] = 3;
      piVar13[uVar30 * 4 + 6] = iVar32;
      chains[lVar33].len = iVar11;
      chains[iVar44].children[1] = iVar32;
      iVar6 = iVar6 + iVar11;
      goto LAB_001057e6;
    }
    if (iVar7 != 3) {
      lVar19 = 0;
      while( true ) {
        iVar7 = (int)lVar19;
        iVar24 = iVar22 + iVar7;
        iVar11 = iVar24 * iVar12 + iVar31;
        if (this->dirImg[iVar11] != '\x01') break;
        puVar15[iVar11] = 0xff;
        puVar15 = this->edgeImg;
        iVar12 = this->width;
        lVar27 = (long)(iVar24 * iVar12 + iVar31);
        if (puVar15[lVar27 + 1] == 0xfe) {
          puVar15[lVar27 + 1] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
          lVar27 = (long)(iVar24 * iVar12 + iVar31);
        }
        if (puVar15[lVar27 + -1] == 0xfe) {
          puVar15[lVar27 + -1] = '\0';
          puVar15 = this->edgeImg;
          iVar12 = this->width;
        }
        iVar11 = iVar22 + iVar7 + 1;
        iVar24 = iVar11 * iVar12;
        lVar27 = (long)(iVar24 + iVar31);
        if (puVar15[lVar27] < 0xfe) {
          if (puVar15[lVar27 + 1] < 0xfe) {
            if (puVar15[lVar27 + -1] < 0xfe) {
              psVar4 = this->gradImg;
              if (psVar4[lVar27 + -1] <= psVar4[lVar27]) {
                iVar31 = iVar31 + (uint)(psVar4[lVar27] < psVar4[lVar27 + 1]);
                goto LAB_001055ff;
              }
              if (psVar4[lVar27 + -1] <= psVar4[lVar27 + 1]) goto LAB_001055bb;
            }
            iVar31 = iVar31 + -1;
          }
          else {
LAB_001055bb:
            iVar31 = iVar31 + 1;
          }
        }
LAB_001055ff:
        iVar24 = iVar24 + iVar31;
        if ((puVar15[iVar24] == 0xff) || ((int)this->gradImg[iVar24] < this->gradThresh)) {
          chains[lVar33].len = iVar7 + 1;
          piVar28 = chains[iVar44].children + 1;
          goto LAB_00105834;
        }
        *(int *)((long)__s + lVar19 * 8 + lVar26 * 8 + 4) = iVar11;
        *(int *)((long)__s + lVar19 * 8 + lVar26 * 8) = iVar31;
        lVar19 = lVar19 + 1;
      }
      *piVar28 = iVar22 + iVar7;
      piVar28[1] = iVar31;
      piVar28[3] = 2;
      piVar28[2] = iVar32;
      piVar13[uVar30 * 4 + 4] = iVar22 + iVar7;
      piVar13[uVar30 * 4 + 5] = iVar31;
      piVar13[uVar30 * 4 + 7] = 1;
      piVar13[uVar30 * 4 + 6] = iVar32;
      chains[lVar33].len = iVar7;
      chains[iVar44].children[1] = iVar32;
      goto LAB_001057de;
    }
    lVar19 = 0;
LAB_0010515d:
    iVar7 = iVar12 * iVar22 + iVar31;
    if (this->dirImg[iVar7] != '\x01') goto LAB_00105724;
    puVar15[iVar7] = 0xff;
    puVar15 = this->edgeImg;
    iVar12 = this->width;
    lVar27 = (long)(iVar12 * iVar22 + iVar31);
    if (puVar15[lVar27 + -1] == 0xfe) {
      puVar15[lVar27 + -1] = '\0';
      puVar15 = this->edgeImg;
      iVar12 = this->width;
      lVar27 = (long)(iVar12 * iVar22 + iVar31);
    }
    if (puVar15[lVar27 + 1] == 0xfe) {
      puVar15[lVar27 + 1] = '\0';
      puVar15 = this->edgeImg;
      iVar12 = this->width;
    }
    iVar22 = iVar22 + -1;
    lVar27 = (long)(iVar12 * iVar22 + iVar31);
    if (puVar15[lVar27] < 0xfe) {
      if (puVar15[lVar27 + -1] < 0xfe) {
        if (puVar15[lVar27 + 1] < 0xfe) {
          psVar4 = this->gradImg;
          if (psVar4[lVar27 + -1] <= psVar4[lVar27]) {
            iVar31 = iVar31 + (uint)(psVar4[lVar27] < psVar4[lVar27 + 1]);
            goto LAB_0010522b;
          }
          if (psVar4[lVar27 + 1] < psVar4[lVar27 + -1]) goto LAB_001051e7;
        }
        iVar31 = iVar31 + 1;
      }
      else {
LAB_001051e7:
        iVar31 = iVar31 + -1;
      }
    }
LAB_0010522b:
    iVar7 = iVar12 * iVar22 + iVar31;
    if ((puVar15[iVar7] != 0xff) && (this->gradThresh <= (int)this->gradImg[iVar7])) {
      *(int *)((long)__s + lVar19 * 8 + lVar26 * 8 + 4) = iVar22;
      *(int *)((long)__s + lVar19 * 8 + lVar26 * 8) = iVar31;
      lVar19 = lVar19 + 1;
      goto LAB_0010515d;
    }
    chains[lVar33].len = (int)lVar19 + 1;
    piVar28 = chains[iVar44].children;
LAB_00105834:
    uVar30 = lVar26 + lVar19;
LAB_00105895:
    uVar18 = uVar18 - 1;
    *piVar28 = iVar32;
    lVar33 = lVar33 + 1;
  } while( true );
  if (iVar6 - local_8c < this->minPathLen) {
    uVar30 = uVar30 & 0xffffffff;
    if (iVar6 < 1) {
      uVar30 = 0;
    }
    for (uVar16 = 0; uVar30 != uVar16; uVar16 = uVar16 + 1) {
      this->edgeImg
      [(long)*(int *)((long)__s + uVar16 * 8) +
       (long)this->width * (long)*(int *)((long)__s + uVar16 * 8 + 4)] = '\0';
      this->edgeImg
      [(long)*(int *)((long)__s + uVar16 * 8) +
       (long)this->width * (long)*(int *)((long)__s + uVar16 * 8 + 4)] = '\0';
    }
  }
  else {
    iVar12 = LongestChain(chains,chains->children[1]);
    if (iVar12 < 1) {
      uVar30 = 0;
    }
    else {
      uVar18 = RetrieveChainNos(chains,chains->children[1],chainNos);
      uVar16 = (ulong)uVar18;
      uVar30 = 0;
      while (0 < (int)uVar16) {
        uVar16 = uVar16 - 1;
        iVar12 = chainNos[uVar16];
        pPVar5 = chains[iVar12].pixels;
        iVar6 = chains[iVar12].len;
        uVar34 = (ulong)iVar6;
        PVar2 = pPVar5[uVar34 - 1];
        pvVar17 = (this->segmentPoints).
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
        uVar30 = uVar30 & 0xffffffff;
        while( true ) {
          iVar22 = (int)(uVar30 - 2);
          if ((iVar22 < 0) ||
             (uVar3 = *(undefined8 *)
                       (*(long *)&(pvVar17->
                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                  )._M_impl.super__Vector_impl_data + (uVar30 - 2 & 0xffffffff) * 8)
             , iVar44 = PVar2.x - (int)uVar3, iVar11 = PVar2.y - (int)((ulong)uVar3 >> 0x20),
             iVar31 = iVar44 >> 0x1f, iVar7 = iVar11 >> 0x1f,
             uVar21 = CONCAT44(iVar11,iVar44) ^ CONCAT44(iVar7,iVar31),
             uVar18 = (int)uVar21 - iVar31, uVar45 = (int)(uVar21 >> 0x20) - iVar7,
             auVar41._0_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
             auVar41._4_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
             auVar41._8_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
             auVar41._12_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
             iVar22 = movmskpd(iVar22,auVar41), iVar22 != 0)) break;
          ppPVar1 = (pointer *)
                    ((long)&(pvVar17->
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                            _M_impl.super__Vector_impl_data + 8);
          *ppPVar1 = *ppPVar1 + -1;
          uVar30 = uVar30 - 1;
        }
        if ((1 < iVar6) &&
           ((0 < (int)uVar30 &&
            (uVar3 = *(undefined8 *)
                      (*(long *)&(this->segmentPoints).
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 ._M_impl.super__Vector_impl_data + -8 + uVar30 * 8),
            iVar22 = pPVar5[uVar34 - 2].x - (int)uVar3,
            iVar31 = pPVar5[uVar34 - 2].y - (int)((ulong)uVar3 >> 0x20), iVar7 = iVar22 >> 0x1f,
            iVar44 = iVar31 >> 0x1f, uVar21 = CONCAT44(iVar31,iVar22) ^ CONCAT44(iVar44,iVar7),
            uVar18 = (int)uVar21 - iVar7, uVar45 = (int)(uVar21 >> 0x20) - iVar44,
            auVar37._0_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
            auVar37._4_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
            auVar37._8_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
            auVar37._12_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
            iVar22 = movmskpd((int)pPVar5,auVar37), iVar22 == 0)))) {
          uVar34 = (ulong)(iVar6 - 1U);
          chains[iVar12].len = iVar6 - 1U;
        }
        lVar33 = (uVar34 & 0xffffffff) * 8;
        while( true ) {
          if ((int)uVar34 < 1) break;
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                    ((this->segmentPoints).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                     (value_type *)((long)&chains[iVar12].pixels[-1].x + lVar33));
          uVar30 = (ulong)((int)uVar30 + 1);
          uVar34 = (ulong)((int)uVar34 - 1);
          lVar33 = lVar33 + -8;
        }
        chains[iVar12].len = 0;
      }
    }
    iVar6 = (int)uVar30;
    iVar12 = LongestChain(chains,chains->children[0]);
    if (1 < iVar12) {
      uVar18 = RetrieveChainNos(chains,chains->children[0],chainNos);
      iVar12 = *chainNos;
      chains[iVar12].pixels = chains[iVar12].pixels + 1;
      chains[iVar12].len = chains[iVar12].len + -1;
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      for (uVar16 = 0; iVar6 = (int)uVar30, uVar16 != uVar18; uVar16 = uVar16 + 1) {
        iVar12 = chainNos[uVar16];
        pPVar5 = chains[iVar12].pixels;
        PVar2 = *pPVar5;
        pvVar17 = (this->segmentPoints).
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
        uVar30 = uVar30 & 0xffffffff;
        while( true ) {
          iVar6 = (int)(uVar30 - 2);
          if ((iVar6 < 0) ||
             (uVar3 = *(undefined8 *)
                       (*(long *)&(pvVar17->
                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                  )._M_impl.super__Vector_impl_data + (uVar30 - 2 & 0xffffffff) * 8)
             , iVar7 = PVar2.x - (int)uVar3, iVar44 = PVar2.y - (int)((ulong)uVar3 >> 0x20),
             iVar22 = iVar7 >> 0x1f, iVar31 = iVar44 >> 0x1f,
             uVar34 = CONCAT44(iVar44,iVar7) ^ CONCAT44(iVar31,iVar22),
             uVar45 = (int)uVar34 - iVar22, uVar46 = (int)(uVar34 >> 0x20) - iVar31,
             auVar42._0_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
             auVar42._4_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
             auVar42._8_4_ = -(uint)(-0x7fffffff < (int)(uVar46 ^ 0x80000000)),
             auVar42._12_4_ = -(uint)(-0x7fffffff < (int)(uVar46 ^ 0x80000000)),
             iVar6 = movmskpd(iVar6,auVar42), iVar6 != 0)) break;
          ppPVar1 = (pointer *)
                    ((long)&(pvVar17->
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                            _M_impl.super__Vector_impl_data + 8);
          *ppPVar1 = *ppPVar1 + -1;
          uVar30 = uVar30 - 1;
        }
        iVar6 = chains[iVar12].len;
        if (iVar6 < 2) {
          uVar34 = 0;
        }
        else {
          uVar34 = 0;
          if (0 < (int)uVar30) {
            uVar3 = *(undefined8 *)
                     (*(long *)&(this->segmentPoints).
                                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data + -8 + uVar30 * 8);
            iVar22 = pPVar5[1].x - (int)uVar3;
            iVar31 = pPVar5[1].y - (int)((ulong)uVar3 >> 0x20);
            iVar7 = iVar22 >> 0x1f;
            iVar44 = iVar31 >> 0x1f;
            uVar34 = CONCAT44(iVar31,iVar22) ^ CONCAT44(iVar44,iVar7);
            uVar45 = (int)uVar34 - iVar7;
            uVar46 = (int)(uVar34 >> 0x20) - iVar44;
            auVar38._0_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
            auVar38._4_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
            auVar38._8_4_ = -(uint)(-0x7fffffff < (int)(uVar46 ^ 0x80000000));
            auVar38._12_4_ = -(uint)(-0x7fffffff < (int)(uVar46 ^ 0x80000000));
            iVar22 = movmskpd((int)pPVar5,auVar38);
            uVar34 = (ulong)(iVar22 == 0);
          }
        }
        uVar21 = (ulong)(uint)((int)uVar34 * 8);
        for (; (long)uVar34 < (long)iVar6; uVar34 = uVar34 + 1) {
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                    ((this->segmentPoints).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                     (value_type *)((long)&(chains[iVar12].pixels)->x + uVar21));
          uVar30 = (ulong)((int)uVar30 + 1);
          iVar6 = chains[iVar12].len;
          uVar21 = uVar21 + 8;
        }
        chains[iVar12].len = 0;
      }
    }
    iVar12 = this->segmentNos;
    pvVar17 = (this->segmentPoints).
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         pvVar17[iVar12].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    iVar22 = __position._M_current[1].x - __position._M_current[(long)iVar6 + -1].x;
    iVar31 = __position._M_current[1].y - __position._M_current[(long)iVar6 + -1].y;
    iVar7 = iVar22 >> 0x1f;
    iVar44 = iVar31 >> 0x1f;
    uVar30 = CONCAT44(iVar31,iVar22) ^ CONCAT44(iVar44,iVar7);
    uVar18 = (int)uVar30 - iVar7;
    uVar45 = (int)(uVar30 >> 0x20) - iVar44;
    auVar39._0_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000));
    auVar39._4_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000));
    auVar39._8_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
    auVar39._12_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
    iVar6 = movmskpd(iVar6,auVar39);
    if (iVar6 == 0) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::erase
                (pvVar17 + iVar12,__position);
      iVar12 = this->segmentNos;
    }
    this->segmentNos = iVar12 + 1;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
    ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
              ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                *)this_00,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_48);
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(&local_48);
    for (lVar33 = 2; lVar33 < iVar32; lVar33 = lVar33 + 1) {
      if (1 < chains[lVar33].len) {
        iVar12 = LongestChain(chains,(int)lVar33);
        if (9 < iVar12) {
          uVar18 = RetrieveChainNos(chains,(int)lVar33,chainNos);
          uVar16 = 0;
          uVar30 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar30 = uVar16;
          }
          uVar34 = 0;
          for (; uVar16 != uVar30; uVar16 = uVar16 + 1) {
            iVar12 = chainNos[uVar16];
            pPVar5 = chains[iVar12].pixels;
            PVar2 = *pPVar5;
            pvVar17 = (this->segmentPoints).
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + this->segmentNos;
            uVar34 = uVar34 & 0xffffffff;
            while( true ) {
              iVar6 = (int)(uVar34 - 2);
              if ((iVar6 < 0) ||
                 (uVar3 = *(undefined8 *)
                           (*(long *)&(pvVar17->
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      )._M_impl.super__Vector_impl_data +
                           (uVar34 - 2 & 0xffffffff) * 8), iVar7 = PVar2.x - (int)uVar3,
                 iVar44 = PVar2.y - (int)((ulong)uVar3 >> 0x20), iVar22 = iVar7 >> 0x1f,
                 iVar31 = iVar44 >> 0x1f, uVar21 = CONCAT44(iVar44,iVar7) ^ CONCAT44(iVar31,iVar22),
                 uVar18 = (int)uVar21 - iVar22, uVar45 = (int)(uVar21 >> 0x20) - iVar31,
                 auVar43._0_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
                 auVar43._4_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000)),
                 auVar43._8_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
                 auVar43._12_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000)),
                 iVar6 = movmskpd(iVar6,auVar43), iVar6 != 0)) break;
              ppPVar1 = (pointer *)
                        ((long)&(pvVar17->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data + 8);
              *ppPVar1 = *ppPVar1 + -1;
              uVar34 = uVar34 - 1;
            }
            iVar6 = chains[iVar12].len;
            if (iVar6 < 2) {
              uVar21 = 0;
            }
            else {
              uVar21 = 0;
              if (0 < (int)uVar34) {
                uVar3 = *(undefined8 *)
                         (*(long *)&(this->segmentPoints).
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    ._M_impl.super__Vector_impl_data + -8 + uVar34 * 8);
                iVar22 = pPVar5[1].x - (int)uVar3;
                iVar31 = pPVar5[1].y - (int)((ulong)uVar3 >> 0x20);
                iVar7 = iVar22 >> 0x1f;
                iVar44 = iVar31 >> 0x1f;
                uVar21 = CONCAT44(iVar31,iVar22) ^ CONCAT44(iVar44,iVar7);
                uVar18 = (int)uVar21 - iVar7;
                uVar45 = (int)(uVar21 >> 0x20) - iVar44;
                auVar40._0_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000));
                auVar40._4_4_ = -(uint)(-0x7fffffff < (int)(uVar18 ^ 0x80000000));
                auVar40._8_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
                auVar40._12_4_ = -(uint)(-0x7fffffff < (int)(uVar45 ^ 0x80000000));
                iVar22 = movmskpd((int)pPVar5,auVar40);
                uVar21 = (ulong)(iVar22 == 0);
              }
            }
            uVar35 = (ulong)(uint)((int)uVar21 * 8);
            for (; (long)uVar21 < (long)iVar6; uVar21 = uVar21 + 1) {
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                        ((this->segmentPoints).
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                         (value_type *)((long)&(chains[iVar12].pixels)->x + uVar35));
              uVar34 = (ulong)((int)uVar34 + 1);
              iVar6 = chains[iVar12].len;
              uVar35 = uVar35 + 8;
            }
            chains[iVar12].len = 0;
          }
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
          ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                    ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                      *)this_00,
                     (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_48);
          std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                    (&local_48);
          this->segmentNos = this->segmentNos + 1;
        }
      }
    }
  }
  goto LAB_00104fe7;
LAB_00105724:
  *piVar28 = iVar22;
  piVar28[1] = iVar31;
  piVar28[3] = 2;
  piVar28[2] = iVar32;
  piVar13[uVar30 * 4 + 4] = iVar22;
  piVar13[uVar30 * 4 + 5] = iVar31;
  piVar13[uVar30 * 4 + 7] = 1;
  piVar13[uVar30 * 4 + 6] = iVar32;
  chains[lVar33].len = (int)lVar19;
  chains[iVar44].children[0] = iVar32;
LAB_001057de:
  iVar6 = iVar6 + (int)lVar19;
LAB_001057e6:
  uVar18 = uVar18 + 1;
  uVar30 = (ulong)(iVar6 - 1);
  lVar33 = lVar33 + 1;
  goto LAB_00105093;
}

Assistant:

void ED::JoinAnchorPointsUsingSortedAnchors()
{
	int *chainNos = new int[(width + height) * 8];

	Point *pixels = new Point[width*height];
	StackNode *stack = new StackNode[width*height];
	Chain *chains = new Chain[width*height];

	// sort the anchor points by their gradient value in decreasing order
	int *A = sortAnchorsByGradValue1();

	// Now join the anchors starting with the anchor having the greatest gradient value
	int totalPixels = 0;

	for (int k = anchorNos - 1; k >= 0; k--) {
		int pixelOffset = A[k];

		int i = pixelOffset / width;
		int j = pixelOffset % width;

		//int i = anchorPoints[k].y;
		//int j = anchorPoints[k].x;

		if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

		chains[0].len = 0;
		chains[0].parent = -1;
		chains[0].dir = 0;
		chains[0].children[0] = chains[0].children[1] = -1;
		chains[0].pixels = NULL;


		int noChains = 1;
		int len = 0;
		int duplicatePixelCount = 0;
		int top = -1;  // top of the stack 

		if (dirImg[i*width + j] == EDGE_VERTICAL) {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_DOWN;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_UP;
			stack[top].parent = 0;

		}
		else {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_RIGHT;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_LEFT;
			stack[top].parent = 0;
		} //end-else

		  // While the stack is not empty
	StartOfWhile:
		while (top >= 0) {
			int r = stack[top].r;
			int c = stack[top].c;
			int dir = stack[top].dir;
			int parent = stack[top].parent;
			top--;

			if (edgeImg[r*width + c] != EDGE_PIXEL) duplicatePixelCount++;

			chains[noChains].dir = dir;   // traversal direction
			chains[noChains].parent = parent;
			chains[noChains].children[0] = chains[noChains].children[1] = -1;


			int chainLen = 0;

			chains[noChains].pixels = &pixels[len];

			pixels[len].y = r;
			pixels[len].x = c;
			len++;
			chainLen++;

			if (dir == ED_LEFT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look LEFT
					//
					//   A
					//   B x 
					//   C 
					//
					// cleanup up & down pixels
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c - 1] >= ANCHOR_PIXEL) { c--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow max. pixel to the LEFT
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[r*width + c - 1];
						int C = gradImg[(r + 1)*width + c - 1];

						if (A > B) {
							if (A > C) r--;
							else       r++;
						}
						else  if (C > B) r++;
						c--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else if (dir == ED_RIGHT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look RIGHT
					//
					//     A
					//   x B
					//     C
					//
					// cleanup up&down pixels
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c + 1] >= ANCHOR_PIXEL) { c++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow max. pixel to the RIGHT
						int A = gradImg[(r - 1)*width + c + 1];
						int B = gradImg[r*width + c + 1];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) r--;       // A
							else       r++;       // C
						}
						else if (C > B) r++;  // C
						c++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;  // Go down
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;   // Go up
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;

			}
			else if (dir == ED_UP) {
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical. Look UP
					//
					//   A B C
					//     x
					//
					// Cleanup left & right pixels
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r - 1)*width + c] >= ANCHOR_PIXEL) { r--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow the max. pixel UP
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[(r - 1)*width + c];
						int C = gradImg[(r - 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;
							else       c++;
						}
						else if (C > B) c++;
						r--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else { // dir == DOWN
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical
					//
					//     x
					//   A B C
					//
					// cleanup side pixels
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r + 1)*width + c] >= ANCHOR_PIXEL) { r++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow the max. pixel DOWN
						int A = gradImg[(r + 1)*width + c - 1];
						int B = gradImg[(r + 1)*width + c];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;       // A
							else       c++;       // C
						}
						else if (C > B) c++;  // C
						r++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else

					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;
			} //end-else

		} //end-while


		if (len - duplicatePixelCount < minPathLen) {
			for (int k = 0; k<len; k++) {

				edgeImg[pixels[k].y*width + pixels[k].x] = 0;
				edgeImg[pixels[k].y*width + pixels[k].x] = 0;

			} //end-for

		}
		else {

			int noSegmentPixels = 0;

			int totalLen = LongestChain(chains, chains[0].children[1]);

			if (totalLen > 0) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[1], chainNos);

				// Copy these pixels in the reverse order
				for (int k = count - 1; k >= 0; k--) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */

					int fr = chains[chainNo].pixels[chains[chainNo].len - 1].y;
					int fc = chains[chainNo].pixels[chains[chainNo].len - 1].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					if (chains[chainNo].len > 1 && noSegmentPixels > 0) {
						fr = chains[chainNo].pixels[chains[chainNo].len - 2].y;
						fc = chains[chainNo].pixels[chains[chainNo].len - 2].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) chains[chainNo].len--;
					} //end-if
#endif

					for (int l = chains[chainNo].len - 1; l >= 0; l--) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if

			totalLen = LongestChain(chains, chains[0].children[0]);
			if (totalLen > 1) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[0], chainNos);

				// Copy these chains in the forward direction. Skip the first pixel of the first chain
				// due to repetition with the last pixel of the previous chain
				int lastChainNo = chainNos[0];
				chains[lastChainNo].pixels++;
				chains[lastChainNo].len--;

				for (int k = 0; k<count; k++) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */
					int fr = chains[chainNo].pixels[0].y;
					int fc = chains[chainNo].pixels[0].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					int startIndex = 0;
					int chainLen = chains[chainNo].len;
					if (chainLen > 1 && noSegmentPixels > 0) {
						int fr = chains[chainNo].pixels[1].y;
						int fc = chains[chainNo].pixels[1].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) { startIndex = 1; }
					} //end-if
#endif

					  /* Start a new chain & copy pixels from the new chain */
					for (int l = startIndex; l<chains[chainNo].len; l++) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if


			  // See if the first pixel can be cleaned up
			int fr = segmentPoints[segmentNos][1].y;
			int fc = segmentPoints[segmentNos][1].x;


			int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
			int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);


			if (dr <= 1 && dc <= 1) {
				segmentPoints[segmentNos].erase(segmentPoints[segmentNos].begin());
				noSegmentPixels--;
			} //end-if

			segmentNos++;
			segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

													  // Copy the rest of the long chains here
			for (int k = 2; k<noChains; k++) {
				if (chains[k].len < 2) continue;

				totalLen = LongestChain(chains, k);

				if (totalLen >= 10) {

					// Retrieve the chainNos
					int count = RetrieveChainNos(chains, k, chainNos);

					// Copy the pixels
					noSegmentPixels = 0;
					for (int k = 0; k<count; k++) {
						int chainNo = chainNos[k];

#if 1					
						/* See if we can erase some pixels from the last chain. This is for cleanup */
						int fr = chains[chainNo].pixels[0].y;
						int fc = chains[chainNo].pixels[0].x;

						int index = noSegmentPixels - 2;
						while (index >= 0) {
							int dr = abs(fr - segmentPoints[segmentNos][index].y);
							int dc = abs(fc - segmentPoints[segmentNos][index].x);

							if (dr <= 1 && dc <= 1) {
								// neighbors. Erase last pixel
								segmentPoints[segmentNos].pop_back();
								noSegmentPixels--;
								index--;
							}
							else break;
						} //end-while

						int startIndex = 0;
						int chainLen = chains[chainNo].len;
						if (chainLen > 1 && noSegmentPixels > 0) {
							int fr = chains[chainNo].pixels[1].y;
							int fc = chains[chainNo].pixels[1].x;

							int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
							int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

							if (dr <= 1 && dc <= 1) { startIndex = 1; }
						} //end-if
#endif
						  /* Start a new chain & copy pixels from the new chain */
						for (int l = startIndex; l<chains[chainNo].len; l++) {
							segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
							noSegmentPixels++;
						} //end-for

						chains[chainNo].len = 0;  // Mark as copied
					} //end-for
					segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments
					segmentNos++;
				} //end-if          
			} //end-for

		} //end-else

	} //end-for-outer

	// pop back last segment from vector
	// because of one preallocation in the beginning, it will always empty
	segmentPoints.pop_back();

	// Clean up
	delete[] A;
	delete[] chains;
	delete[] stack;
	delete[] chainNos;
	delete[] pixels;
}